

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall CMU462::Application::exit_2D_GL_draw_mode(Application *this)

{
  Application *this_local;
  
  glMatrixMode(0x1701);
  glPopMatrix();
  glMatrixMode(0x1700);
  glPopMatrix();
  glPopAttrib();
  glEnable(0xb71);
  glEnable(0xb50);
  return;
}

Assistant:

void Application::exit_2D_GL_draw_mode()
{
  glMatrixMode( GL_PROJECTION );
  glPopMatrix();
  glMatrixMode( GL_MODELVIEW );
  glPopMatrix();
  glPopAttrib();
  glEnable(GL_DEPTH_TEST);
  glEnable(GL_LIGHTING);
}